

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall asl::Array<asl::String>::free(Array<asl::String> *this,void *__ptr)

{
  int iVar1;
  long lVar2;
  String *pSVar3;
  
  pSVar3 = this->_a;
  iVar1 = *(int *)&pSVar3[-1].field_2;
  if ((long)iVar1 != 0) {
    lVar2 = 0;
    do {
      if (*(int *)((long)&pSVar3->_size + lVar2) != 0) {
        ::free(*(void **)((long)&pSVar3->field_2 + lVar2));
      }
      lVar2 = lVar2 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar2);
    pSVar3 = this->_a;
  }
  ::free(&pSVar3[-1].field_2);
  this->_a = (String *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}